

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::i64_Trunc_f64u(w3Interp *this)

{
  double *pdVar1;
  ulong uVar2;
  
  pdVar1 = w3Stack::f64(&this->super_w3Stack);
  uVar2 = (ulong)*pdVar1;
  w3Stack::set_u64(&this->super_w3Stack,
                   (long)(*pdVar1 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2);
  return;
}

Assistant:

INTERP (i64_Trunc_f64u)
{
    set_u64 ((uint64_t)f64 ());
}